

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_ShowCursor(int toggle)

{
  SDL_bool SVar1;
  bool bVar2;
  SDL_bool wanthide;
  int retval;
  int toggle_local;
  
  bVar2 = VideoCursorHidden == SDL_FALSE;
  if ((-1 < toggle) && (SVar1 = (SDL_bool)(toggle == 0), VideoCursorHidden != SVar1)) {
    (*SDL20_ShowCursor)(SUB14(SVar1 == SDL_FALSE,0));
    VideoCursorHidden = SVar1;
    UpdateRelativeMouseMode();
  }
  return (uint)bVar2;
}

Assistant:

SDLCALL
SDL_ShowCursor(int toggle)
{
    const int retval = VideoCursorHidden ? 0 : 1;

    if (toggle >= 0) {
        const SDL_bool wanthide = (toggle == 0) ? SDL_TRUE : SDL_FALSE;
        if (VideoCursorHidden != wanthide) {
            SDL20_ShowCursor(wanthide ? 0 : 1);
            VideoCursorHidden = wanthide;
            UpdateRelativeMouseMode();
        }
    }
    return retval;
}